

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msf_gif.h
# Opt level: O2

int msf_gif_frame(MsfGifState *handle,uint8_t *pixelData,int centiSecondsPerFame,int maxBitDepth,
                 int pitchInBytes)

{
  uint *puVar1;
  int iVar2;
  size_t __n;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  int16_t *piVar15;
  MsfGifState *pMVar16;
  uint32_t uVar17;
  int i;
  int iVar18;
  uint uVar19;
  undefined8 *puVar20;
  MsfGifBuffer *pMVar21;
  byte bVar22;
  byte bVar23;
  long lVar24;
  ulong uVar25;
  short sVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint *puVar37;
  undefined8 *puVar38;
  byte *pbVar39;
  byte *pbVar40;
  byte bVar41;
  char cVar42;
  uint uVar43;
  uint uVar44;
  ulong uVar45;
  uint8_t temp;
  byte bVar46;
  uint *puVar47;
  byte bVar48;
  uint8_t *puVar49;
  uint uVar50;
  uint uVar51;
  uint32_t code;
  ulong uVar52;
  bool bVar53;
  short sVar54;
  short sVar56;
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar61;
  uint uVar63;
  uint uVar64;
  undefined1 auVar62 [16];
  uint uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint32_t uStack_2041c;
  ulong uStack_20418;
  uint *puStack_20410;
  ulong uStack_20408;
  ulong uStack_20400;
  int16_t *piStack_203f8;
  int iStack_203ec;
  MsfGifState *pMStack_203e8;
  undefined8 *puStack_203e0;
  ulong uStack_203d8;
  undefined8 *puStack_203d0;
  MsfCookedFrame *pMStack_203c8;
  size_t sStack_203c0;
  uint *puStack_203b8;
  long lStack_203b0;
  long lStack_203a8;
  long lStack_203a0;
  uint8_t *puStack_20398;
  ulong uStack_20390;
  byte *pbStack_20388;
  int iStack_2037c;
  undefined4 *puStack_20378;
  undefined4 *puStack_20370;
  MsfCookedFrame *pMStack_20368;
  byte *pbStack_20360;
  undefined8 *puStack_20358;
  uint8_t *puStack_20350;
  Color3 table [256];
  MsfCookedFrame tmp;
  uint8_t used [65537];
  
  if (handle->listHead == (MsfGifBuffer *)0x0) {
    return 0;
  }
  if (0xf < maxBitDepth) {
    maxBitDepth = 0x10;
  }
  if (maxBitDepth < 2) {
    maxBitDepth = 1;
  }
  if (pitchInBytes == 0) {
    pitchInBytes = handle->width << 2;
  }
  uVar29 = handle->height;
  puVar38 = (undefined8 *)0x0;
  puVar20 = (undefined8 *)-(long)(int)((uVar29 - 1) * pitchInBytes);
  if (-1 < pitchInBytes) {
    puVar20 = puVar38;
  }
  lVar31 = (long)handle->width;
  uVar34 = (handle->previousFrame).count;
  uVar45 = (ulong)uVar34;
  if ((int)uVar34 < 2) {
    uVar45 = 1;
  }
  iVar18 = (int)(0xa0 / uVar45) + (handle->previousFrame).depth;
  if (maxBitDepth < iVar18) {
    iVar18 = maxBitDepth;
  }
  puStack_20350 = pixelData + (long)puVar20;
  puStack_20370 = &msf_cook_frame_rdepthsArray;
  puStack_20378 = &msf_cook_frame_bdepthsArray;
  if (msf_gif_bgra_flag == 0) {
    puStack_20378 = &msf_cook_frame_rdepthsArray;
  }
  pMStack_20368 = &handle->currentFrame;
  if (msf_gif_bgra_flag == 0) {
    puStack_20370 = &msf_cook_frame_bdepthsArray;
  }
  puStack_203b8 = (handle->currentFrame).pixels;
  puStack_20410 = (uint *)(lVar31 + -3);
  uVar34 = handle->width * uVar29;
  lStack_203a0 = (long)pitchInBytes;
  puStack_203e0 = (undefined8 *)(ulong)uVar29;
  if ((int)uVar29 < 1) {
    puStack_203e0 = puVar38;
  }
  puStack_20358 = (undefined8 *)(ulong)uVar34;
  if ((int)uVar34 < 1) {
    puStack_20358 = puVar38;
  }
  lVar24 = (long)iVar18;
  lStack_203a8 = lVar31 * 4;
  pbStack_20360 = pixelData + 3 + (long)puVar20;
  uStack_20408 = 1;
  pMStack_203e8 = handle;
  iStack_2037c = centiSecondsPerFame;
  while( true ) {
    puVar47 = puStack_203b8;
    uVar29 = puStack_20378[lVar24];
    uVar34 = (&msf_cook_frame_gdepthsArray)[lVar24];
    uVar44 = puStack_20370[lVar24];
    iVar18 = uVar29 + uVar44 + uVar34;
    piStack_203f8 = (int16_t *)CONCAT44(piStack_203f8._4_4_,iVar18);
    bVar23 = (byte)iVar18 & 0x1f;
    uVar50 = 1 << bVar23;
    lStack_203b0 = lVar24;
    memset(used,0,(long)(int)(uVar50 + 1));
    auVar14 = _DAT_001bf7e0;
    bVar48 = (byte)uVar34;
    auVar57._0_4_ = (int)(float)((8 - uVar29) * 0x800000 + 0x3f800000);
    auVar57._4_4_ = (int)(float)((8 - uVar44) * 0x800000 + 0x3f800000);
    auVar57._8_4_ = 1;
    auVar57._12_4_ = 1;
    auVar62._4_4_ = auVar57._4_4_;
    auVar62._0_4_ = auVar57._4_4_;
    auVar62._8_4_ = 1;
    auVar62._12_4_ = 1;
    auVar55._0_4_ = (float)(int)(-auVar57._0_4_ ^ 0xffffffff);
    auVar55._4_4_ = (float)(int)(-auVar57._4_4_ ^ 0xffffffff);
    auVar55._8_4_ = (float)(int)((uint)((auVar57._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff);
    auVar55._12_4_ = (float)(int)((uint)((auVar62._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff);
    auVar66._0_4_ = (float)DAT_001bf7c0 - auVar55._0_4_;
    auVar66._4_4_ = DAT_001bf7c0._4_4_ - auVar55._4_4_;
    auVar66._8_4_ = DAT_001bf7c0._8_4_ - auVar55._8_4_;
    auVar66._12_4_ = DAT_001bf7c0._12_4_ - auVar55._12_4_;
    bVar22 = (byte)uVar29;
    uVar35 = ~(-1 << (bVar48 & 0x1f)) << (bVar22 & 0x1f);
    auVar57 = divps(auVar66,_DAT_001bf7c0);
    uVar32 = (~(-1 << ((byte)uVar44 & 0x1f)) << (bVar22 & 0x1f)) << (bVar48 & 0x1f);
    auVar58._0_4_ = (int)(auVar57._0_4_ * 257.0);
    auVar58._4_4_ = (int)(auVar57._4_4_ * 257.0);
    auVar58._8_4_ = (int)(auVar57._8_4_ * 0.0);
    auVar58._12_4_ = (int)(auVar57._12_4_ * 0.0);
    auVar57 = pshuflw(auVar55,auVar58,0xe8);
    uVar19 = 0x10 - uVar29;
    uVar43 = 0x20 - (int)piStack_203f8;
    uStack_20390 = CONCAT44(uStack_20390._4_4_,uVar43);
    sStack_203c0 = CONCAT44(sStack_203c0._4_4_,uVar32);
    sVar26 = (short)(int)(((255.0 - (float)~(-1 << (8 - bVar48 & 0x1f))) / 255.0) * 257.0);
    uVar27 = uVar19 - uVar34;
    uStack_20400 = CONCAT44(uStack_20400._4_4_,uVar35);
    pMStack_203c8 = (MsfCookedFrame *)CONCAT44(pMStack_203c8._4_4_,(int)(short)auVar58._4_4_);
    iStack_203ec = uVar27 - uVar44;
    puVar20 = (undefined8 *)(ulong)(uint)(0 << (bVar22 & 0x1f));
    pbVar40 = pbStack_20360;
    puVar49 = puStack_20350;
    while (pbVar39 = pbVar40, puVar38 = puVar20, iVar18 = msf_gif_alpha_threshold,
          puVar38 != puStack_203e0) {
      uVar36 = (int)puVar38 * 4 & 0xc;
      piStack_203f8 = (int16_t *)(ulong)uVar36;
      lVar24 = (long)piStack_203f8 * 4;
      uVar51 = *(uint *)(msf_cook_frame_ditherKernel + lVar24);
      uVar3 = *(uint *)(msf_cook_frame_ditherKernel + lVar24 + 4);
      uVar4 = *(uint *)(msf_cook_frame_ditherKernel + lVar24 + 8);
      uVar5 = *(uint *)(msf_cook_frame_ditherKernel + lVar24 + 0xc);
      uVar45 = (ulong)uVar29;
      auVar60._0_4_ = uVar51 >> uVar45;
      auVar60._4_4_ = uVar3 >> uVar45;
      auVar60._8_4_ = uVar4 >> uVar45;
      auVar60._12_4_ = uVar5 >> uVar45;
      uVar45 = (ulong)uVar44;
      auVar59._0_4_ = (uVar51 >> uVar45) << 0x10;
      auVar59._4_4_ = (uVar3 >> uVar45) << 0x10;
      auVar59._8_4_ = (uVar4 >> uVar45) << 0x10;
      auVar59._12_4_ = (uVar5 >> uVar45) << 0x10;
      puVar37 = puVar47;
      pbVar40 = pbVar39;
      for (lVar24 = 0; lVar24 < (long)puStack_20410; lVar24 = lVar24 + 4) {
        auVar55 = *(undefined1 (*) [16])(puVar49 + lVar24 * 4);
        auVar62 = auVar55 & auVar14;
        sVar54 = auVar57._0_2_;
        auVar70._0_2_ = auVar62._0_2_ * sVar54;
        sVar56 = auVar57._2_2_;
        auVar70._2_2_ = auVar62._2_2_ * sVar56;
        auVar70._4_2_ = auVar62._4_2_ * sVar54;
        auVar70._6_2_ = auVar62._6_2_ * sVar56;
        auVar70._8_2_ = auVar62._8_2_ * sVar54;
        auVar70._10_2_ = auVar62._10_2_ * sVar56;
        auVar70._12_2_ = auVar62._12_2_ * sVar54;
        auVar70._14_2_ = auVar62._14_2_ * sVar56;
        auVar62 = paddusw(auVar70,auVar59 | auVar60);
        auVar66 = auVar62 & _DAT_001bf7f0;
        uVar25 = (ulong)uVar19;
        uVar52 = (ulong)uVar43;
        auVar67._0_4_ = auVar55._0_4_ >> 8;
        auVar67._4_4_ = auVar55._4_4_ >> 8;
        auVar67._8_4_ = auVar55._8_4_ >> 8;
        auVar67._12_4_ = auVar55._12_4_ >> 8;
        auVar67 = auVar67 & _DAT_001bf800;
        auVar68._0_2_ = auVar67._0_2_ * sVar26;
        sVar54 = sVar26 >> 0xf;
        auVar68._2_2_ = auVar67._2_2_ * sVar54;
        auVar68._4_2_ = auVar67._4_2_ * sVar26;
        auVar68._6_2_ = auVar67._6_2_ * sVar54;
        auVar68._8_2_ = auVar67._8_2_ * sVar26;
        auVar68._10_2_ = auVar67._10_2_ * sVar54;
        auVar68._12_2_ = auVar67._12_2_ * sVar26;
        auVar68._14_2_ = auVar67._14_2_ * sVar54;
        uVar45 = (ulong)uVar34;
        auVar69._0_4_ = uVar51 >> uVar45;
        auVar69._4_4_ = uVar3 >> uVar45;
        auVar69._8_4_ = uVar4 >> uVar45;
        auVar69._12_4_ = uVar5 >> uVar45;
        auVar70 = paddusw(auVar69,auVar68);
        uVar45 = (ulong)uVar27;
        uVar61 = -(uint)((int)(auVar55._0_4_ >> 0x18) < iVar18);
        uVar63 = -(uint)((int)(auVar55._4_4_ >> 0x18) < iVar18);
        uVar64 = -(uint)((int)(auVar55._8_4_ >> 0x18) < iVar18);
        uVar65 = -(uint)((int)(auVar55._12_4_ >> 0x18) < iVar18);
        puVar1 = puVar47 + lVar24;
        *puVar1 = ~uVar61 & (auVar70._0_4_ >> uVar45 & uVar35 |
                            auVar62._0_4_ >> uVar52 & uVar32 | auVar66._0_4_ >> uVar25) |
                  uVar50 & uVar61;
        puVar1[1] = ~uVar63 & (auVar70._4_4_ >> uVar45 & uVar35 |
                              auVar62._4_4_ >> uVar52 & uVar32 | auVar66._4_4_ >> uVar25) |
                    uVar50 & uVar63;
        puVar1[2] = ~uVar64 & (auVar70._8_4_ >> uVar45 & uVar35 |
                              auVar62._8_4_ >> uVar52 & uVar32 | auVar66._8_4_ >> uVar25) |
                    uVar50 & uVar64;
        puVar1[3] = ~uVar65 & (auVar70._12_4_ >> uVar45 & uVar35 |
                              auVar62._12_4_ >> uVar52 & uVar32 | auVar66._12_4_ >> uVar25) |
                    uVar50 & uVar65;
        puVar37 = puVar37 + 4;
        pbVar40 = pbVar40 + 0x10;
      }
      for (; lVar24 < lVar31; lVar24 = lVar24 + 1) {
        uVar51 = uVar50;
        if (msf_gif_alpha_threshold <= (int)(uint)*pbVar40) {
          iVar18 = *(int *)(msf_cook_frame_ditherKernel + (ulong)((uint)lVar24 & 3 | uVar36) * 4);
          iVar30 = (iVar18 >> ((byte)uVar44 & 0x1f)) + (uint)pbVar40[-1] * (int)(short)auVar58._4_4_
          ;
          if (0xfffe < iVar30) {
            iVar30 = 0xffff;
          }
          iVar33 = (iVar18 >> (bVar48 & 0x1f)) + (uint)pbVar40[-2] * (int)sVar26;
          if (0xfffe < iVar33) {
            iVar33 = 0xffff;
          }
          iVar18 = (iVar18 >> (bVar22 & 0x1f)) + (uint)pbVar40[-3] * auVar58._0_4_;
          if (0xfffe < iVar18) {
            iVar18 = 0xffff;
          }
          uVar51 = iVar18 >> ((byte)uVar19 & 0x1f) |
                   iVar33 >> ((byte)uVar27 & 0x1f) & uVar35 |
                   iVar30 >> ((byte)iStack_203ec & 0x1f) & uVar32;
        }
        *puVar37 = uVar51;
        puVar37 = puVar37 + 1;
        pbVar40 = pbVar40 + 4;
      }
      puVar47 = (uint *)((long)puVar47 + lStack_203a8);
      puVar49 = puVar49 + lStack_203a0;
      pbVar40 = pbVar39 + lStack_203a0;
      puStack_203d0 = puVar38;
      pbStack_20388 = pbVar39;
      puVar20 = (undefined8 *)((long)puVar38 + 1);
    }
    for (puVar20 = (undefined8 *)0x0; puStack_20358 != puVar20;
        puVar20 = (undefined8 *)((long)puVar20 + 1)) {
      used[puStack_203b8[(long)puVar20]] = '\x01';
    }
    uVar25 = 0;
    uVar45 = (ulong)uVar50;
    if (1 << bVar23 < 1) {
      uVar45 = uVar25;
    }
    uVar34 = 0;
    for (; uVar45 != uVar25; uVar25 = uVar25 + 1) {
      uVar34 = uVar34 + used[uVar25];
    }
    uStack_20418 = (ulong)uVar29;
    uStack_203d8 = (ulong)uVar44;
    if (uVar34 < 0x100) break;
    lVar24 = lStack_203b0 + -1;
    if (lVar24 == 0) {
      iVar18 = 0;
LAB_00158adb:
      iVar30 = puStack_20378[iVar18];
      iVar33 = (&msf_cook_frame_gdepthsArray)[iVar18];
      iVar2 = puStack_20370[iVar18];
      (pMStack_203e8->currentFrame).pixels = puStack_203b8;
      (pMStack_203e8->currentFrame).depth = iVar18;
      (pMStack_203e8->currentFrame).count = uVar34;
      (pMStack_203e8->currentFrame).rbits = iVar30;
      (pMStack_203e8->currentFrame).gbits = iVar33;
      (pMStack_203e8->currentFrame).bbits = iVar2;
      iVar18 = pMStack_203e8->width;
      iVar28 = pMStack_203e8->height;
      piStack_203f8 = pMStack_203e8->lzwMem;
      uVar29 = iVar28 * iVar18;
      puVar20 = (undefined8 *)malloc((long)((int)(uVar29 * 3) / 2 + 0x330));
      if (puVar20 != (undefined8 *)0x0) {
        lStack_203a8 = CONCAT44(lStack_203a8._4_4_,iVar28);
        lStack_203a0 = CONCAT44(lStack_203a0._4_4_,iVar18);
        uStack_203d8 = (ulong)(uint)(iVar33 + iVar30);
        bVar23 = (byte)iVar2;
        uVar34 = 1 << ((char)(iVar33 + iVar30) + bVar23 & 0x1f);
        uVar25 = 0;
        puStack_203e0 = puVar20;
        puStack_203d0 = puVar20;
        uStack_20390 = (ulong)uVar29;
        memset(table,0,0x300);
        puVar38 = puStack_203d0;
        puVar20 = puStack_203e0;
        lStack_203b0 = (long)(int)uVar34;
        *(undefined1 *)((long)&tmp.pixels + lStack_203b0) = 0;
        bVar48 = (byte)iVar30;
        bVar22 = (byte)iVar33;
        sStack_203c0 = CONCAT44(sStack_203c0._4_4_,iVar30 * 2);
        pMStack_203c8 = (MsfCookedFrame *)CONCAT44(pMStack_203c8._4_4_,iVar33 * 3);
        iStack_203ec = iVar2 * 2;
        pbStack_20388 = (byte *)CONCAT44(pbStack_20388._4_4_,msf_gif_bgra_flag);
        uVar45 = 0;
        if (0 < (int)uVar34) {
          uVar45 = (ulong)uVar34;
        }
        for (; iVar18 = (int)uStack_20408, uVar45 != uVar25; uVar25 = uVar25 + 1) {
          if (used[uVar25] != '\0') {
            uVar34 = (uint)uVar25;
            uVar29 = uVar34 << (8 - bVar48 & 0x1f);
            uVar44 = (uVar34 >> (bVar48 & 0x1f)) << (8 - bVar22 & 0x1f);
            iVar28 = (uVar34 >> ((byte)uStack_203d8 & 0x1f)) << (8 - bVar23 & 0x1f);
            uVar19 = uVar29 & 0xff;
            uVar34 = uVar44 & 0xff;
            bVar46 = (byte)(uVar19 >> (bVar48 * '\x03' & 0x1f)) | (byte)uVar29 |
                     (byte)(uVar19 >> ((byte)(iVar30 * 2) & 0x1f)) |
                     (byte)(uVar19 >> (bVar48 & 0x1f));
            bVar41 = (byte)(iVar28 >> (bVar23 * '\x03' & 0x1f)) | (byte)iVar28 |
                     (byte)(iVar28 >> ((byte)iStack_203ec & 0x1f)) |
                     (byte)(iVar28 >> (bVar23 & 0x1f));
            table[iVar18].r = bVar46;
            table[iVar18].g =
                 (byte)(uVar34 >> ((byte)(iVar33 * 3) & 0x1f)) | (byte)uVar44 |
                 (byte)(uVar34 >> (bVar22 * '\x02' & 0x1f)) | (byte)(uVar34 >> (bVar22 & 0x1f));
            *(char *)((long)&tmp.pixels + uVar25) = (char)uStack_20408;
            table[iVar18].b = bVar41;
            if (msf_gif_bgra_flag != 0) {
              table[iVar18].r = bVar41;
              table[iVar18].b = bVar46;
            }
            uStack_20408 = (ulong)(iVar18 + 1);
          }
        }
        uVar29 = 0x1f;
        if (iVar18 - 1U != 0) {
          for (; iVar18 - 1U >> uVar29 == 0; uVar29 = uVar29 - 1) {
          }
        }
        uVar34 = (uVar29 ^ 0xffffffe0) + 0x21;
        uVar29 = 2;
        if (2 < uVar34) {
          uVar29 = uVar34;
        }
        bVar23 = (byte)uVar29;
        uVar29 = 1 << (bVar23 & 0x1f);
        uStack_20400 = (ulong)uVar29;
        if (iVar30 == (pMStack_203e8->previousFrame).rbits) {
          bVar53 = iVar2 == (pMStack_203e8->previousFrame).bbits &&
                   iVar33 == (pMStack_203e8->previousFrame).gbits;
        }
        else {
          bVar53 = false;
        }
        puStack_20410 = (pMStack_203e8->previousFrame).pixels;
        uStack_20418 = (ulong)CONCAT31((int3)((uint)iVar2 >> 8),used[lStack_203b0] == '\0' & bVar53)
        ;
        if ((used[lStack_203b0] != '\0') && (0 < pMStack_203e8->framesSubmitted)) {
          pMStack_203e8->listTail->field_0x13 = 9;
        }
        *(undefined4 *)(puStack_203e0 + 2) = 0x504f921;
        *(short *)((long)puStack_203e0 + 0x14) = (short)iStack_2037c;
        *(undefined4 *)((long)puStack_203e0 + 0x16) = 0x2c0000;
        *(undefined4 *)((long)puStack_203e0 + 0x19) = 0;
        *(short *)((long)puStack_203e0 + 0x1d) = (short)lStack_203a0;
        *(short *)((long)puStack_203e0 + 0x1f) = (short)lStack_203a8;
        *(byte *)((long)puStack_203e0 + 0x21) = bVar23 - 1 | 0x80;
        __n = (long)(int)uVar29 * 3;
        memcpy((void *)((long)puStack_203d0 + 0x22),table,__n);
        puStack_20398 = (uint8_t *)((long)puVar38 + __n + 0x23);
        *(byte *)((long)puVar20 + __n + 0x22) = bVar23;
        code = 0;
        memset((void *)((long)puVar38 + __n + 0x24),0,0x103);
        *(undefined1 *)((long)puVar20 + __n + 0x23) = 0xff;
        uStack_2041c = 8;
        sStack_203c0 = (long)((int)uStack_20408 << 0xc) * 2;
        memset(piStack_203f8,0xff,sStack_203c0);
        uVar44 = uVar29 + 1;
        uVar34 = 0x1f;
        if (uVar44 != 0) {
          for (; uVar44 >> uVar34 == 0; uVar34 = uVar34 - 1) {
          }
        }
        msf_put_code(&puStack_20398,&uStack_2041c,(uVar34 ^ 0xffffffe0) + 0x21,uVar29);
        if (((char)uStack_20418 == '\0') || (*puStack_203b8 != *puStack_20410)) {
          code = (uint32_t)*(byte *)((long)&tmp.pixels + (ulong)*puStack_203b8);
        }
        puStack_203d0 = puStack_203d0 + 2;
        pMStack_203c8 = &pMStack_203e8->previousFrame;
        uVar34 = (int)uStack_20400 + 2;
        uVar25 = (ulong)(int)uStack_20390;
        lVar31 = 1;
        uVar45 = uStack_20408;
        puVar47 = puStack_203b8;
        cVar42 = (char)uStack_20418;
        uVar29 = uVar34;
        uStack_203d8 = uVar25;
        while( true ) {
          piVar15 = piStack_203f8;
          if ((long)uVar25 <= lVar31) break;
          if ((cVar42 == '\0') || (uVar52 = 0, puVar47[lVar31] != puStack_20410[lVar31])) {
            uVar52 = (ulong)*(byte *)((long)&tmp.pixels + (ulong)puVar47[lVar31]);
          }
          iVar18 = code * (int)uVar45;
          uVar17 = (int)piStack_203f8[(long)iVar18 + uVar52];
          if (piStack_203f8[(long)iVar18 + uVar52] < 0) {
            uVar19 = 0x1f;
            if (uVar29 - 1 != 0) {
              for (; uVar29 - 1 >> uVar19 == 0; uVar19 = uVar19 - 1) {
              }
            }
            iVar30 = (uVar19 ^ 0xffffffe0) + 0x21;
            msf_put_code(&puStack_20398,&uStack_2041c,iVar30,code);
            uVar17 = (uint32_t)uVar52;
            if ((int)uVar29 < 0x1000) {
              piVar15[(long)iVar18 + uVar52] = (int16_t)uVar29;
              uVar29 = uVar29 + 1;
              uVar45 = uStack_20408;
              puVar47 = puStack_203b8;
              uVar25 = uStack_203d8;
              cVar42 = (char)uStack_20418;
            }
            else {
              msf_put_code(&puStack_20398,&uStack_2041c,iVar30,(uint32_t)uStack_20400);
              memset(piStack_203f8,0xff,sStack_203c0);
              uVar45 = uStack_20408;
              puVar47 = puStack_203b8;
              uVar25 = uStack_203d8;
              cVar42 = (char)uStack_20418;
              uVar29 = uVar34;
            }
          }
          code = uVar17;
          lVar31 = lVar31 + 1;
        }
        uVar34 = 0x1f;
        if (uVar29 - 1 != 0) {
          for (; uVar29 - 1 >> uVar34 == 0; uVar34 = uVar34 - 1) {
          }
        }
        uVar34 = (uVar34 ^ 0xffffffe0) + 0x21;
        if (0xb < uVar34) {
          uVar34 = 0xc;
        }
        msf_put_code(&puStack_20398,&uStack_2041c,uVar34,code);
        uVar34 = 0x1f;
        if (uVar29 != 0) {
          for (; uVar29 >> uVar34 == 0; uVar34 = uVar34 - 1) {
          }
        }
        uVar29 = (uVar34 ^ 0xffffffe0) + 0x21;
        if (0xb < uVar29) {
          uVar29 = 0xc;
        }
        msf_put_code(&puStack_20398,&uStack_2041c,uVar29,uVar44);
        puVar20 = puStack_203e0;
        pMVar16 = pMStack_203e8;
        puVar49 = puStack_20398;
        if (8 < uStack_2041c) {
          uVar29 = uStack_2041c + 7 >> 3;
          *puStack_20398 = (char)uVar29 + 0xff;
          puVar49 = puStack_20398 + uVar29;
        }
        *puVar49 = '\0';
        *puStack_203e0 = 0;
        puStack_203e0[1] = puVar49 + (1 - (long)puStack_203d0);
        pMVar21 = (MsfGifBuffer *)
                  realloc(puStack_203e0,(size_t)(puVar49 + (0x11 - (long)puStack_203d0)));
        if (pMVar21 != (MsfGifBuffer *)0x0) {
          pMVar16->listTail->next = pMVar21;
          pMVar16->listTail = pMVar21;
          puVar6 = pMStack_203c8->pixels;
          iVar28 = pMStack_203c8->depth;
          iVar9 = pMStack_203c8->count;
          iVar10 = pMStack_203c8->rbits;
          iVar11 = pMStack_203c8->gbits;
          iVar12 = pMStack_203c8->bbits;
          uVar13 = *(undefined4 *)&pMStack_203c8->field_0x1c;
          puVar7 = pMStack_20368->pixels;
          iVar33 = pMStack_20368->depth;
          iVar2 = pMStack_20368->count;
          iVar18 = pMStack_20368->gbits;
          iVar30 = pMStack_20368->bbits;
          uVar8 = *(undefined4 *)&pMStack_20368->field_0x1c;
          pMStack_203c8->rbits = pMStack_20368->rbits;
          pMStack_203c8->gbits = iVar18;
          pMStack_203c8->bbits = iVar30;
          *(undefined4 *)&pMStack_203c8->field_0x1c = uVar8;
          pMStack_203c8->pixels = puVar7;
          pMStack_203c8->depth = iVar33;
          pMStack_203c8->count = iVar2;
          pMStack_20368->pixels = puVar6;
          pMStack_20368->depth = iVar28;
          pMStack_20368->count = iVar9;
          pMStack_20368->rbits = iVar10;
          pMStack_20368->gbits = iVar11;
          pMStack_20368->bbits = iVar12;
          *(undefined4 *)&pMStack_20368->field_0x1c = uVar13;
          pMVar16->framesSubmitted = pMVar16->framesSubmitted + 1;
          return 1;
        }
        free(puVar20);
      }
      msf_free_gif_state(pMStack_203e8);
      return 0;
    }
  }
  iVar18 = (int)lStack_203b0;
  goto LAB_00158adb;
}

Assistant:

int msf_gif_frame(MsfGifState * handle, uint8_t * pixelData, int centiSecondsPerFame, int maxBitDepth, int pitchInBytes)
{ MsfTimeFunc
    if (!handle->listHead) { return 0; }

    maxBitDepth = msf_imax(1, msf_imin(16, maxBitDepth));
    if (pitchInBytes == 0) pitchInBytes = handle->width * 4;
    if (pitchInBytes < 0) pixelData -= pitchInBytes * (handle->height - 1);

    uint8_t used[(1 << 16) + 1]; //only 64k, so stack allocating is fine
    msf_cook_frame(&handle->currentFrame, pixelData, used, handle->width, handle->height, pitchInBytes,
        msf_imin(maxBitDepth, handle->previousFrame.depth + 160 / msf_imax(1, handle->previousFrame.count)));

    MsfGifBuffer * buffer = msf_compress_frame(handle->customAllocatorContext, handle->width, handle->height,
        centiSecondsPerFame, handle->currentFrame, handle, used, handle->lzwMem);
    if (!buffer) { msf_free_gif_state(handle); return 0; }
    handle->listTail->next = buffer;
    handle->listTail = buffer;

    //swap current and previous frames
    MsfCookedFrame tmp = handle->previousFrame;
    handle->previousFrame = handle->currentFrame;
    handle->currentFrame = tmp;

    handle->framesSubmitted += 1;
    return 1;
}